

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall
SplitOnceTest_random_Test<signed_char>::TestBody(SplitOnceTest_random_Test<signed_char> *this)

{
  value_type in_delim;
  char *pcVar1;
  AssertHelper aAStack_e8 [8];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  split_result;
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  data;
  
  in_delim = '\0';
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::RandomTestData(&data,'\0',0,0);
  jessilib::
  split_once<,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            (&split_result,(jessilib *)&data.m_str,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)0x0,in_delim);
  testing::internal::
  CmpHelperEQ<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            ((internal *)&gtest_ar,"split_result.first","data.m_tokens[0]",&split_result.first,
             data.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_e8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::get_remainder((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                   *)&gtest_ar,&data,1);
  testing::internal::
  CmpHelperEQ<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            ((internal *)&gtest_ar_1,"split_result.second","data.get_remainder(1)",
             &split_result.second,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)&gtest_ar);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_e8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::
  pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::~pair(&split_result);
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::~RandomTestData(&data);
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string<TypeParam>, std::basic_string<TypeParam>> split_result = split_once(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}